

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

Table * __thiscall
wasm::Module::addTable
          (Module *this,unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *curr)

{
  Table *pTVar1;
  allocator<char> local_41;
  string local_40;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> local_20;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *local_18;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *curr_local;
  Module *this_local;
  
  local_18 = curr;
  curr_local = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)this;
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::unique_ptr(&local_20,curr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"addTable",&local_41);
  pTVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>,wasm::Table>
                     (&this->tables,&this->tablesMap,&local_20,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>::~unique_ptr(&local_20);
  return pTVar1;
}

Assistant:

Table* Module::addTable(std::unique_ptr<Table>&& curr) {
  return addModuleElement(tables, tablesMap, std::move(curr), "addTable");
}